

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_Vec3To(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *other;
  AActor *this;
  DVector3 u;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0043790c;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004378f3:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043790c:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e4f,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_00437856;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0043790c;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_004378f3;
LAB_00437856:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0043792b;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_004378fc:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0043792b;
  }
  other = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_00437885;
  }
  else {
    if (other != (AActor *)0x0) goto LAB_004378fc;
LAB_00437885:
    NullParam("\"t\"");
    other = (AActor *)param[1].field_0.field_1.a;
    if (other == (AActor *)0x0) {
      other = (AActor *)0x0;
      goto LAB_004378b9;
    }
  }
  bVar1 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar3 = "t == NULL || t->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0043792b:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e50,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_004378b9:
  AActor::Vec3To(&u,this,other);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e51,
                    "int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetVector(ret,&u);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vec3To)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(t, AActor)
	ACTION_RETURN_VEC3(self->Vec3To(t));
}